

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  uint in_EDI;
  ImGuiID hover_delay_id;
  ImGuiWindow *unaff_retaddr;
  float delay;
  ImGuiItemStatusFlags status_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiID local_28;
  float local_20;
  ImGuiContext *pIVar4;
  undefined4 in_stack_fffffffffffffffc;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar4 = GImGui;
  if ((((GImGui->NavDisableMouseHover & 1U) == 0) || ((GImGui->NavDisableHighlight & 1U) != 0)) ||
     ((in_EDI & 0x400) != 0)) {
    uVar1 = (GImGui->LastItemData).StatusFlags;
    if ((uVar1 & 1) == 0) {
      return false;
    }
    if (((GImGui->HoveredWindow != pIVar2) && ((uVar1 & 0x80) == 0)) && ((in_EDI & 0x100) == 0)) {
      return false;
    }
    if ((((in_EDI & 0x80) == 0) && (GImGui->ActiveId != 0)) &&
       ((GImGui->ActiveId != (GImGui->LastItemData).ID &&
        (((GImGui->ActiveIdAllowOverlap & 1U) == 0 && (GImGui->ActiveId != pIVar2->MoveId)))))) {
      return false;
    }
    bVar3 = IsWindowContentHoverable
                      ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                       (ImGuiHoveredFlags)((ulong)GImGui >> 0x20));
    if ((!bVar3) && (((pIVar4->LastItemData).InFlags & 0x100U) == 0)) {
      return false;
    }
    if ((((pIVar4->LastItemData).InFlags & 4U) != 0) && ((in_EDI & 0x200) == 0)) {
      return false;
    }
    if (((pIVar4->LastItemData).ID == pIVar2->MoveId) && ((pIVar2->WriteAccessed & 1U) != 0)) {
      return false;
    }
  }
  else {
    if ((((GImGui->LastItemData).InFlags & 4U) != 0) && ((in_EDI & 0x200) == 0)) {
      return false;
    }
    bVar3 = IsItemFocused();
    if (!bVar3) {
      return false;
    }
  }
  if ((in_EDI & 0x800) == 0) {
    if ((in_EDI & 0x1000) == 0) {
      local_20 = 0.0;
    }
    else {
      local_20 = (pIVar4->IO).HoverDelayShort;
    }
  }
  else {
    local_20 = (pIVar4->IO).HoverDelayNormal;
  }
  if (local_20 <= 0.0) {
    bVar3 = true;
  }
  else {
    if ((pIVar4->LastItemData).ID == 0) {
      local_28 = ImGuiWindow::GetIDFromRectangle
                           (unaff_retaddr,(ImRect *)CONCAT44(in_stack_fffffffffffffffc,in_EDI));
    }
    else {
      local_28 = (pIVar4->LastItemData).ID;
    }
    if (((in_EDI & 0x2000) != 0) && (pIVar4->HoverDelayIdPreviousFrame != local_28)) {
      pIVar4->HoverDelayTimer = 0.0;
    }
    pIVar4->HoverDelayId = local_28;
    bVar3 = local_20 <= pIVar4->HoverDelayTimer;
  }
  return bVar3;
}

Assistant:

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavDisableMouseHover && !g.NavDisableHighlight && !(flags & ImGuiHoveredFlags_NoNavOverride))
    {
        if ((g.LastItemData.InFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
            return false;
        if (!IsItemFocused())
            return false;
    }
    else
    {
        // Test for bounding box overlap, as updated as ItemAdd()
        ImGuiItemStatusFlags status_flags = g.LastItemData.StatusFlags;
        if (!(status_flags & ImGuiItemStatusFlags_HoveredRect))
            return false;
        IM_ASSERT((flags & (ImGuiHoveredFlags_AnyWindow | ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows | ImGuiHoveredFlags_NoPopupHierarchy)) == 0);   // Flags not supported by this function

        // Done with rectangle culling so we can perform heavier checks now
        // Test if we are hovering the right window (our window could be behind another window)
        // [2021/03/02] Reworked / reverted the revert, finally. Note we want e.g. BeginGroup/ItemAdd/EndGroup to work as well. (#3851)
        // [2017/10/16] Reverted commit 344d48be3 and testing RootWindow instead. I believe it is correct to NOT test for RootWindow but this leaves us unable
        // to use IsItemHovered() after EndChild() itself. Until a solution is found I believe reverting to the test from 2017/09/27 is safe since this was
        // the test that has been running for a long while.
        if (g.HoveredWindow != window && (status_flags & ImGuiItemStatusFlags_HoveredWindow) == 0)
            if ((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0)
                return false;

        // Test if another item is active (e.g. being dragged)
        if ((flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem) == 0)
            if (g.ActiveId != 0 && g.ActiveId != g.LastItemData.ID && !g.ActiveIdAllowOverlap && g.ActiveId != window->MoveId)
                return false;

        // Test if interactions on this window are blocked by an active popup or modal.
        // The ImGuiHoveredFlags_AllowWhenBlockedByPopup flag will be tested here.
        if (!IsWindowContentHoverable(window, flags) && !(g.LastItemData.InFlags & ImGuiItemFlags_NoWindowHoverableCheck))
            return false;

        // Test if the item is disabled
        if ((g.LastItemData.InFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
            return false;

        // Special handling for calling after Begin() which represent the title bar or tab.
        // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
        if (g.LastItemData.ID == window->MoveId && window->WriteAccessed)
            return false;
    }

    // Handle hover delay
    // (some ideas: https://www.nngroup.com/articles/timing-exposing-content)
    float delay;
    if (flags & ImGuiHoveredFlags_DelayNormal)
        delay = g.IO.HoverDelayNormal;
    else if (flags & ImGuiHoveredFlags_DelayShort)
        delay = g.IO.HoverDelayShort;
    else
        delay = 0.0f;
    if (delay > 0.0f)
    {
        ImGuiID hover_delay_id = (g.LastItemData.ID != 0) ? g.LastItemData.ID : window->GetIDFromRectangle(g.LastItemData.Rect);
        if ((flags & ImGuiHoveredFlags_NoSharedDelay) && (g.HoverDelayIdPreviousFrame != hover_delay_id))
            g.HoverDelayTimer = 0.0f;
        g.HoverDelayId = hover_delay_id;
        return g.HoverDelayTimer >= delay;
    }

    return true;
}